

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

void __thiscall
capnp::SchemaLoader::Validator::validateTypeId(Validator *this,uint64_t id,Which expectedKind)

{
  Impl *this_00;
  uint64_t id_00;
  CapTableReader *pCVar1;
  SegmentReader *pSVar2;
  char (*in_R8) [2];
  Which *pWVar3;
  Which WVar4;
  StringPtr name;
  Which expectedKind_local;
  uint64_t id_local;
  uint local_b8;
  uint local_b4;
  Fault f;
  Reader node;
  DebugComparison<capnp::schema::Node::Which,_capnp::schema::Node::Which_&> _kjCondition;
  ArrayPtr<const_char> local_48;
  WirePointer *local_38;
  int local_30;
  
  local_48.size_ = (size_t)local_48.ptr;
  expectedKind_local = expectedKind;
  id_local = id;
  _kjCondition._0_8_ = id;
  kj::
  Table<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
  ::find<0ul,unsigned_long&>
            ((Table<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
              *)&node,(unsigned_long *)&this->loader->schemas);
  id_00 = id_local;
  if (node._reader.segment == (SegmentReader *)0x0) {
    pWVar3 = (Which *)0x0;
  }
  else {
    pWVar3 = *(Which **)&(node._reader.segment)->id;
  }
  if (pWVar3 == (Which *)0x0) {
    this_00 = this->loader;
    kj::str<char_const(&)[23],capnp::Text::Reader&,char_const(&)[2]>
              ((String *)&node,(kj *)"(unknown type used by ",(char (*) [23])&this->nodeName,
               (Reader *)0x21b182,in_R8);
    pSVar2 = node._reader.segment;
    if (node._reader.capTable == (CapTableReader *)0x0) {
      pSVar2 = (SegmentReader *)0x237f1b;
    }
    name.content.size_ =
         (long)&(node._reader.capTable)->_vptr_CapTableReader +
         (ulong)(node._reader.capTable == (CapTableReader *)0x0);
    name.content.ptr = (char *)pSVar2;
    _kjCondition.right = (Which *)Impl::loadEmpty(this_00,id_00,name,expectedKind_local,true);
    _kjCondition._0_8_ = id_00;
    local_48.ptr = (char *)&f;
    kj::
    Table<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::TreeIndex<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
    ::
    upsert<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::upsert<capnp::SchemaLoader::Validator::validateTypeId(unsigned_long,capnp::schema::Node::Which)::_lambda(auto:1&,auto:2&&)_2_>(unsigned_long,capnp::_::RawSchema*,capnp::SchemaLoader::Validator::validateTypeId(unsigned_long,capnp::schema::Node::Which)::_lambda(auto:1&,auto:2&&)_2_&&)::_lambda(kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Entry&,kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Entry&&)_1_>
              ((Table<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::TreeIndex<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
                *)&this->dependencies,(Entry *)&_kjCondition,(anon_class_8_1_6f242a07 *)&local_48);
    pCVar1 = node._reader.capTable;
    pSVar2 = node._reader.segment;
    if (node._reader.segment != (SegmentReader *)0x0) {
      node._reader.segment = (SegmentReader *)0x0;
      node._reader.capTable = (CapTableReader *)0x0;
      (*(code *)**node._reader.data)(node._reader.data,pSVar2,1,pCVar1,pCVar1,0);
    }
  }
  else {
    _kjCondition.op.content.ptr = *(char **)(pWVar3 + 4);
    _kjCondition.left = FILE;
    _kjCondition._2_6_ = 0;
    _kjCondition.right = (Which *)0x0;
    _kjCondition.op.content.size_ = CONCAT44(_kjCondition.op.content.size_._4_4_,0x7fffffff);
    WVar4 = FILE;
    capnp::_::PointerReader::getStruct(&node._reader,(PointerReader *)&_kjCondition,(word *)0x0);
    if (0x6f < node._reader.dataSize) {
      WVar4 = *(Which *)((long)node._reader.data + 0xc);
    }
    _kjCondition.right = &expectedKind_local;
    _kjCondition.left = WVar4;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = WVar4 == expectedKind_local;
    if (_kjCondition.result) {
      _kjCondition._0_8_ = id_local;
      local_48.ptr = (char *)&f;
      _kjCondition.right = pWVar3;
      kj::
      Table<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::TreeIndex<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
      ::
      upsert<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::upsert<capnp::SchemaLoader::Validator::validateTypeId(unsigned_long,capnp::schema::Node::Which)::_lambda(auto:1&,auto:2&&)_1_>(unsigned_long,capnp::_::RawSchema*,capnp::SchemaLoader::Validator::validateTypeId(unsigned_long,capnp::schema::Node::Which)::_lambda(auto:1&,auto:2&&)_1_&&)::_lambda(kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Entry&,kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Entry&&)_1_>
                ((Table<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::TreeIndex<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
                  *)&this->dependencies,(Entry *)&_kjCondition,(anon_class_8_1_6f242a07 *)&local_48)
      ;
    }
    else {
      local_b8 = 0;
      local_b4 = (uint)expectedKind_local;
      if (0x6f < node._reader.dataSize) {
        local_b8 = (uint)*(ushort *)((long)node._reader.data + 0xc);
      }
      if (node._reader.pointerCount == 0) {
        node._reader.nestingLimit = 0x7fffffff;
        node._reader.capTable = (CapTableReader *)0x0;
        node._reader.pointers = (WirePointer *)0x0;
        node._reader.segment = (SegmentReader *)0x0;
      }
      local_48.size_ = (size_t)node._reader.capTable;
      local_48.ptr = (char *)node._reader.segment;
      local_38 = node._reader.pointers;
      local_30 = node._reader.nestingLimit;
      local_48 = (ArrayPtr<const_char>)
                 capnp::_::PointerReader::getBlob<capnp::Text>
                           ((PointerReader *)&local_48,(void *)0x0,0);
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::schema::Node::Which,capnp::schema::Node::Which&>&,char_const(&)[46],unsigned_long&,unsigned_int,unsigned_int,capnp::Text::Reader>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x260,FAILED,"node.which() == expectedKind",
                 "_kjCondition,\"expected a different kind of node for this ID\", id, (uint)expectedKind, (uint)node.which(), node.getDisplayName()"
                 ,&_kjCondition,(char (*) [46])"expected a different kind of node for this ID",
                 &id_local,&local_b4,&local_b8,(Reader *)&local_48);
      this->isValid = false;
      kj::_::Debug::Fault::~Fault(&f);
    }
  }
  return;
}

Assistant:

void validateTypeId(uint64_t id, schema::Node::Which expectedKind) {
    _::RawSchema* existing = loader.tryGet(id).schema;
    if (existing != nullptr) {
      auto node = readMessageUnchecked<schema::Node>(existing->encodedNode);
      VALIDATE_SCHEMA(node.which() == expectedKind,
          "expected a different kind of node for this ID",
          id, (uint)expectedKind, (uint)node.which(), node.getDisplayName());
      dependencies.upsert(id, existing, [](auto&,auto&&) { /* ignore dupe */ });
      return;
    }

    dependencies.upsert(id, loader.loadEmpty(
        id, kj::str("(unknown type used by ", nodeName , ")"), expectedKind, true),
        [](auto&,auto&&) { /* ignore dupe */ });
  }